

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void null_line_error(Terminal *term,wchar_t y,wchar_t lineno,tree234 *whichtree,wchar_t treeindex,
                    char *varname)

{
  wchar_t wVar1;
  wchar_t wVar2;
  tree234 *ptVar3;
  tree234 *ptVar4;
  tree234 *ptVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *varname_local;
  wchar_t treeindex_local;
  tree234 *whichtree_local;
  wchar_t lineno_local;
  wchar_t y_local;
  Terminal *term_local;
  
  wVar1 = term->cols;
  wVar2 = term->rows;
  ptVar3 = term->scrollback;
  iVar6 = count234(term->scrollback);
  ptVar4 = term->screen;
  iVar7 = count234(term->screen);
  ptVar5 = term->alt_screen;
  iVar8 = count234(term->alt_screen);
  modalfatalbox("%s==NULL in terminal.c\nlineno=%d y=%d w=%d h=%d\ncount(scrollback=%p)=%d\ncount(screen=%p)=%d\ncount(alt=%p)=%d alt_sblines=%d\nwhichtree=%p treeindex=%d\ncommitid=%s\n\nPlease contact <putty@projects.tartarus.org> and pass on the above information."
                ,varname,(ulong)(uint)lineno,(ulong)(uint)y,(ulong)(uint)wVar1,(ulong)(uint)wVar2,
                ptVar3,iVar6,ptVar4,iVar7,ptVar5,iVar8,term->alt_sblines,whichtree,treeindex,
                "a33cf2240ef44c68537b116440c3184460e62bff");
}

Assistant:

static void null_line_error(Terminal *term, int y, int lineno,
                            tree234 *whichtree, int treeindex,
                            const char *varname)
{
    modalfatalbox("%s==NULL in terminal.c\n"
                  "lineno=%d y=%d w=%d h=%d\n"
                  "count(scrollback=%p)=%d\n"
                  "count(screen=%p)=%d\n"
                  "count(alt=%p)=%d alt_sblines=%d\n"
                  "whichtree=%p treeindex=%d\n"
                  "commitid=%s\n\n"
                  "Please contact <putty@projects.tartarus.org> "
                  "and pass on the above information.",
                  varname, lineno, y, term->cols, term->rows,
                  term->scrollback, count234(term->scrollback),
                  term->screen, count234(term->screen),
                  term->alt_screen, count234(term->alt_screen),
                  term->alt_sblines, whichtree, treeindex, commitid);
}